

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

DOHcode doh_rdata(uchar *doh,size_t dohlen,unsigned_short rdlength,unsigned_short type,int index,
                 dohentry *d)

{
  DOHcode DVar1;
  DOHcode rc;
  dohentry *d_local;
  int index_local;
  unsigned_short type_local;
  unsigned_short rdlength_local;
  size_t dohlen_local;
  uchar *doh_local;
  
  switch(type) {
  case 1:
    if (rdlength != 4) {
      return DOH_DNS_RDATA_LEN;
    }
    doh_store_a(doh,index,d);
    break;
  default:
    break;
  case 5:
    DVar1 = doh_store_cname(doh,dohlen,index,d);
    if (DVar1 != DOH_OK) {
      return DVar1;
    }
    break;
  case 0x1c:
    if (rdlength != 0x10) {
      return DOH_DNS_RDATA_LEN;
    }
    doh_store_aaaa(doh,index,d);
    break;
  case 0x27:
  }
  return DOH_OK;
}

Assistant:

static DOHcode doh_rdata(const unsigned char *doh,
                         size_t dohlen,
                         unsigned short rdlength,
                         unsigned short type,
                         int index,
                         struct dohentry *d)
{
  /* RDATA
     - A (TYPE 1):  4 bytes
     - AAAA (TYPE 28): 16 bytes
     - NS (TYPE 2): N bytes
     - HTTPS (TYPE 65): N bytes */
  DOHcode rc;

  switch(type) {
  case DNS_TYPE_A:
    if(rdlength != 4)
      return DOH_DNS_RDATA_LEN;
    doh_store_a(doh, index, d);
    break;
  case DNS_TYPE_AAAA:
    if(rdlength != 16)
      return DOH_DNS_RDATA_LEN;
    doh_store_aaaa(doh, index, d);
    break;
#ifdef USE_HTTPSRR
  case DNS_TYPE_HTTPS:
    rc = doh_store_https(doh, index, d, rdlength);
    if(rc)
      return rc;
    break;
#endif
  case DNS_TYPE_CNAME:
    rc = doh_store_cname(doh, dohlen, (unsigned int)index, d);
    if(rc)
      return rc;
    break;
  case DNS_TYPE_DNAME:
    /* explicit for clarity; just skip; rely on synthesized CNAME  */
    break;
  default:
    /* unsupported type, just skip it */
    break;
  }
  return DOH_OK;
}